

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

int fast_expansion_sum(int elen,double *e,int flen,double *f,double *h)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar11 = *e;
  dVar10 = *f;
  bVar8 = dVar11 < dVar10 == dVar10 <= -dVar11;
  if (bVar8) {
    dVar9 = f[1];
  }
  else {
    dVar9 = dVar10;
    dVar10 = dVar11;
    dVar11 = e[1];
  }
  uVar7 = (ulong)!bVar8;
  uVar6 = (ulong)bVar8;
  uVar1 = (uint)!bVar8;
  uVar4 = (uint)bVar8;
  uVar2 = 0;
  if ((int)uVar4 < flen && (int)uVar1 < elen) {
    if (dVar11 < dVar9 == dVar9 <= -dVar11) {
      dVar12 = dVar10 + dVar9;
      *h = dVar10 - (dVar12 - dVar9);
      uVar6 = (ulong)(uVar4 + 1);
      dVar9 = f[uVar6];
      dVar10 = dVar12;
    }
    else {
      dVar12 = dVar10 + dVar11;
      *h = dVar10 - (dVar12 - dVar11);
      uVar7 = (ulong)(uVar1 + 1);
      dVar11 = e[uVar7];
      dVar10 = dVar12;
    }
    uVar1 = (uint)uVar7;
    uVar4 = (uint)uVar6;
    uVar2 = 1;
    if ((int)uVar4 < flen && (int)uVar1 < elen) {
      uVar2 = 1;
      do {
        if (dVar11 < dVar9 == dVar9 <= -dVar11) {
          dVar12 = dVar10 + dVar9;
          h[uVar2] = (dVar10 - (dVar12 - (dVar12 - dVar10))) + (dVar9 - (dVar12 - dVar10));
          iVar5 = (int)uVar6;
          uVar6 = (ulong)(iVar5 + 1);
          dVar9 = f[(long)iVar5 + 1];
          dVar10 = dVar12;
        }
        else {
          dVar12 = dVar10 + dVar11;
          h[uVar2] = (dVar10 - (dVar12 - (dVar12 - dVar10))) + (dVar11 - (dVar12 - dVar10));
          iVar5 = (int)uVar7;
          uVar7 = (ulong)(iVar5 + 1);
          dVar11 = e[(long)iVar5 + 1];
          dVar10 = dVar12;
        }
        uVar4 = (uint)uVar6;
        uVar2 = uVar2 + 1;
        uVar1 = (uint)uVar7;
      } while (((int)uVar1 < elen) && ((int)uVar4 < flen));
    }
  }
  if ((int)uVar1 < elen) {
    lVar3 = 0;
    dVar12 = dVar10;
    do {
      dVar10 = dVar12 + dVar11;
      h[(uVar2 & 0xffffffff) + lVar3] =
           (dVar12 - (dVar10 - (dVar10 - dVar12))) + (dVar11 - (dVar10 - dVar12));
      dVar11 = e[(long)(int)uVar1 + lVar3 + 1];
      lVar3 = lVar3 + 1;
      dVar12 = dVar10;
    } while ((long)elen - (long)(int)uVar1 != lVar3);
    uVar2 = (ulong)(uint)((int)uVar2 + (int)lVar3);
  }
  uVar1 = (uint)uVar2;
  if ((int)uVar4 < flen) {
    lVar3 = 0;
    dVar11 = dVar10;
    do {
      dVar10 = dVar11 + dVar9;
      h[(uVar2 & 0xffffffff) + lVar3] =
           (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar9 - (dVar10 - dVar11));
      dVar9 = f[(long)(int)uVar4 + lVar3 + 1];
      lVar3 = lVar3 + 1;
      dVar11 = dVar10;
    } while ((long)flen - (long)(int)uVar4 != lVar3);
    uVar1 = uVar1 + (int)lVar3;
  }
  h[uVar1] = dVar10;
  return uVar1 + 1;
}

Assistant:

int fast_expansion_sum(int elen, REAL *e, int flen, REAL *f, REAL *h)
/* h cannot be e or f. */
{
  REAL Q;
  INEXACT REAL Qnew;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  REAL enow, fnow;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    Q = enow;
    enow = e[++eindex];
  } else {
    Q = fnow;
    fnow = f[++findex];
  }
  hindex = 0;
  if ((eindex < elen) && (findex < flen)) {
    if ((fnow > enow) == (fnow > -enow)) {
      Fast_Two_Sum(enow, Q, Qnew, h[0]);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, Q, Qnew, h[0]);
      fnow = f[++findex];
    }
    Q = Qnew;
    hindex = 1;
    while ((eindex < elen) && (findex < flen)) {
      if ((fnow > enow) == (fnow > -enow)) {
        Two_Sum(Q, enow, Qnew, h[hindex]);
        enow = e[++eindex];
      } else {
        Two_Sum(Q, fnow, Qnew, h[hindex]);
        fnow = f[++findex];
      }
      Q = Qnew;
      hindex++;
    }
  }
  while (eindex < elen) {
    Two_Sum(Q, enow, Qnew, h[hindex]);
    enow = e[++eindex];
    Q = Qnew;
    hindex++;
  }
  while (findex < flen) {
    Two_Sum(Q, fnow, Qnew, h[hindex]);
    fnow = f[++findex];
    Q = Qnew;
    hindex++;
  }
  h[hindex] = Q;
  return hindex + 1;
}